

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

string * getUserInputDirForFile(string *__return_storage_ptr__,string *filename)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  Settings *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar2 = Settings::searchPathAmount();
  this = (Settings *)0x0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  uVar4 = extraout_RDX;
  while( true ) {
    if (iVar2 == (int)this) {
      while( true ) {
        std::operator<<((ostream *)&std::cout,
                        "Please specify the directory where this library is located (or enter \'quit\' to abort): "
                       );
        fflush(_stdout);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        std::operator>>((istream *)&std::cin,(string *)__return_storage_ptr__);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        iVar2 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
        if (iVar2 == 0) {
          exit(1);
        }
        if ((__return_storage_ptr__->_M_string_length != 0) &&
           ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1]
            != '/')) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::operator+(&local_50,__return_storage_ptr__,filename);
        bVar1 = fileExists(&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if (bVar1) break;
        std::operator+(&local_50,__return_storage_ptr__,filename);
        poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&local_50);
        poVar3 = std::operator<<(poVar3," does not exist. Try again");
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      std::operator+(&local_50,__return_storage_ptr__,filename);
      poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&local_50);
      poVar3 = std::operator<<(poVar3,
                               " was found. /!\\ DYLIBBUNDLER MAY NOT CORRECTLY HANDLE THIS DEPENDENCY: Manually check the executable with \'otool -L\'"
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&local_50);
      Settings::addSearchPath(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    Settings::searchPath_abi_cxx11_(__return_storage_ptr__,this,(int)uVar4);
    if ((__return_storage_ptr__->_M_string_length != 0) &&
       ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] !=
        '/')) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::operator+(&local_50,__return_storage_ptr__,filename);
    bVar1 = fileExists(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) break;
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    this = (Settings *)(ulong)((int)this + 1);
    uVar4 = extraout_RDX_00;
  }
  std::operator+(&local_50,__return_storage_ptr__,filename);
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&local_50);
  poVar3 = std::operator<<(poVar3,
                           " was found. /!\\ DYLIBBUNDLER MAY NOT CORRECTLY HANDLE THIS DEPENDENCY: Manually check the executable with \'otool -L\'"
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string getUserInputDirForFile(const std::string& filename)
{
    const int searchPathAmount = Settings::searchPathAmount();
    for(int n=0; n<searchPathAmount; n++)
    {
        auto searchPath = Settings::searchPath(n);
        if( !searchPath.empty() && searchPath[ searchPath.size()-1 ] != '/' ) searchPath += "/";

        if( fileExists( searchPath+filename ) )
        {
            std::cerr << (searchPath+filename) << " was found. /!\\ DYLIBBUNDLER MAY NOT CORRECTLY HANDLE THIS DEPENDENCY: Manually check the executable with 'otool -L'" << std::endl;
            return searchPath;
        }
    }

    while (true)
    {
        std::cout << "Please specify the directory where this library is located (or enter 'quit' to abort): ";  fflush(stdout);

        std::string prefix;
        std::cin >> prefix;
        std::cout << std::endl;

        if(prefix.compare("quit")==0) exit(1);

        if( !prefix.empty() && prefix[ prefix.size()-1 ] != '/' ) prefix += "/";

        if( !fileExists( prefix+filename ) )
        {
            std::cerr << (prefix+filename) << " does not exist. Try again" << std::endl;
            continue;
        }
        else
        {
            std::cerr << (prefix+filename) << " was found. /!\\ DYLIBBUNDLER MAY NOT CORRECTLY HANDLE THIS DEPENDENCY: Manually check the executable with 'otool -L'" << std::endl;
            Settings::addSearchPath(prefix);
            return prefix;
        }
    }
}